

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::Simulator::trigger_event
          (Simulator *this,Var *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *bits_mask)

{
  queue<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::deque<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>_>
  *this_00;
  unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
  *this_01;
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  *this_02;
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  undefined4 extraout_var;
  iterator iVar5;
  mapped_type *pmVar6;
  const_iterator cVar7;
  __node_base *p_Var8;
  __node_base *p_Var9;
  undefined8 *puVar10;
  Simulator *pSVar11;
  undefined1 local_98 [8];
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  vs;
  key_type local_50;
  Var *root;
  Simulator *local_40;
  Var *local_38;
  Var *var_local;
  
  if ((bits_mask->_M_h)._M_element_count != 0) {
    root = (Var *)&this->dependency_;
    local_40 = this;
    local_38 = var;
    iVar2 = std::
            _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)root,&local_38);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pmVar3 = std::__detail::
               _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)root,&local_38);
      p_Var8 = &(pmVar3->_M_h)._M_before_begin;
      this_01 = &local_40->scope_;
      this_00 = &local_40->event_queue_;
      while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
        iVar4 = std::
                _Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&this_01->_M_h,(key_type *)(p_Var8 + 1));
        if (iVar4.super__Node_iterator_base<kratos::Stmt_*,_false>._M_cur == (__node_type *)0x0) {
          vs._M_h._M_buckets = *(__buckets_ptr *)(p_Var8 + 1);
          local_98 = (undefined1  [8])local_38;
          std::
          deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
          ::emplace_back<std::pair<kratos::Var_const*,kratos::Stmt*>>
                    ((deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
                      *)this_00,(pair<const_kratos::Var_*,_kratos::Stmt_*> *)local_98);
        }
      }
    }
    iVar1 = (*(local_38->super_IRNode)._vptr_IRNode[0x28])();
    pSVar11 = local_40;
    local_50 = (key_type)CONCAT44(extraout_var,iVar1);
    this_02 = &local_40->linked_dependency_;
    iVar5 = std::
            _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_02->_M_h,&local_50);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pmVar6 = std::__detail::
               _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_02,&local_50);
      local_98 = (undefined1  [8])&vs._M_h._M_rehash_policy._M_next_resize;
      vs._M_h._M_buckets = (__buckets_ptr)0x1;
      vs._M_h._M_bucket_count = 0;
      vs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      vs._M_h._M_element_count._0_4_ = 0x3f800000;
      vs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      vs._M_h._M_rehash_policy._4_4_ = 0;
      vs._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var9 = &(pmVar6->_M_h)._M_before_begin;
      while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
        cVar7 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&bits_mask->_M_h,(key_type *)(p_Var9 + 1));
        if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
          std::
          _Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<kratos::Var*const&>
                    ((_Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_98,(_Prime_rehash_policy *)(p_Var9 + 2));
        }
      }
      for (puVar10 = (undefined8 *)vs._M_h._M_bucket_count; puVar10 != (undefined8 *)0x0;
          puVar10 = (undefined8 *)*puVar10) {
        iVar2 = std::
                _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)root,(key_type *)(puVar10 + 1));
        if (iVar2.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          pmVar3 = std::__detail::
                   _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)root,(key_type *)(puVar10 + 1));
          p_Var8 = &(pmVar3->_M_h)._M_before_begin;
          while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
            iVar4 = std::
                    _Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&(pSVar11->scope_)._M_h,(key_type *)(p_Var8 + 1));
            if (iVar4.super__Node_iterator_base<kratos::Stmt_*,_false>._M_cur == (__node_type *)0x0)
            {
              vs._M_h._M_single_bucket = (__node_base_ptr)local_38;
              std::
              deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
              ::emplace_back<std::pair<kratos::Var_const*,kratos::Stmt*>>
                        ((deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
                          *)&pSVar11->event_queue_,
                         (pair<const_kratos::Var_*,_kratos::Stmt_*> *)&vs._M_h._M_single_bucket);
            }
          }
        }
      }
      std::
      _Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_98);
      pSVar11 = local_40;
    }
    pSVar11->simulation_depth_ = pSVar11->simulation_depth_ + 1;
  }
  return;
}

Assistant:

void Simulator::trigger_event(const kratos::Var *var,
                              const std::unordered_set<uint32_t> &bits_mask) {
    if (bits_mask.empty()) return;

    if (dependency_.find(var) != dependency_.end()) {
        auto const &deps = dependency_.at(var);
        for (auto const &stmt : deps) {
            if (scope_.find(stmt) == scope_.end()) event_queue_.emplace(std::make_pair(var, stmt));
        }
    }

    const auto *root = var->get_var_root_parent();
    if (linked_dependency_.find(root) != linked_dependency_.end()) {
        auto const &vars = linked_dependency_.at(root);
        std::unordered_set<Var *> vs;
        for (const auto &[bit, v] : vars) {
            if (bits_mask.find(bit) != bits_mask.end()) vs.emplace(v);
        }

        for (auto const &v : vs) {
            if (dependency_.find(v) != dependency_.end()) {
                auto const &deps = dependency_.at(v);
                for (auto const &stmt : deps) {
                    if (scope_.find(stmt) == scope_.end())
                        event_queue_.emplace(std::make_pair(var, stmt));
                }
            }
        }
    }

    // trigger linked events as well
    simulation_depth_++;
}